

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O3

void CollectHistogram_SSE2
               (uint8_t *ref,uint8_t *pred,int start_block,int end_block,VP8Histogram *histo)

{
  long lVar1;
  long lVar2;
  short sVar3;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar4 [16];
  short sVar11;
  short sVar12;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  undefined1 auVar13 [16];
  short sVar20;
  int16_t out [16];
  int distribution [32];
  ushort local_d8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  if (start_block < end_block) {
    lVar2 = (long)start_block;
    do {
      FTransform_SSE2(ref + VP8DspScan[lVar2],pred + VP8DspScan[lVar2],(int16_t *)local_d8);
      sVar3 = -local_d8[0];
      sVar5 = -local_d8[1];
      sVar6 = -local_d8[2];
      sVar7 = -local_d8[3];
      sVar8 = -local_d8[4];
      sVar9 = -local_d8[5];
      sVar10 = -local_d8[6];
      sVar11 = -local_d8[7];
      auVar13._0_2_ =
           (sVar3 < (short)local_d8[0]) * local_d8[0] |
           (ushort)(sVar3 >= (short)local_d8[0]) * sVar3;
      auVar13._2_2_ =
           (sVar5 < (short)local_d8[1]) * local_d8[1] |
           (ushort)(sVar5 >= (short)local_d8[1]) * sVar5;
      auVar13._4_2_ =
           (sVar6 < (short)local_d8[2]) * local_d8[2] |
           (ushort)(sVar6 >= (short)local_d8[2]) * sVar6;
      auVar13._6_2_ =
           (sVar7 < (short)local_d8[3]) * local_d8[3] |
           (ushort)(sVar7 >= (short)local_d8[3]) * sVar7;
      auVar13._8_2_ =
           (sVar8 < (short)local_d8[4]) * local_d8[4] |
           (ushort)(sVar8 >= (short)local_d8[4]) * sVar8;
      auVar13._10_2_ =
           (sVar9 < (short)local_d8[5]) * local_d8[5] |
           (ushort)(sVar9 >= (short)local_d8[5]) * sVar9;
      auVar13._12_2_ =
           (sVar10 < (short)local_d8[6]) * local_d8[6] |
           (ushort)(sVar10 >= (short)local_d8[6]) * sVar10;
      auVar13._14_2_ =
           (sVar11 < (short)local_d8[7]) * local_d8[7] |
           (ushort)(sVar11 >= (short)local_d8[7]) * sVar11;
      sVar3 = -local_d8[8];
      sVar5 = -local_d8[9];
      sVar6 = -local_d8[10];
      sVar7 = -local_d8[0xb];
      sVar8 = -local_d8[0xc];
      sVar9 = -local_d8[0xd];
      sVar10 = -local_d8[0xe];
      sVar11 = -local_d8[0xf];
      auVar4._0_2_ = (sVar3 < (short)local_d8[8]) * local_d8[8] |
                     (ushort)(sVar3 >= (short)local_d8[8]) * sVar3;
      auVar4._2_2_ = (sVar5 < (short)local_d8[9]) * local_d8[9] |
                     (ushort)(sVar5 >= (short)local_d8[9]) * sVar5;
      auVar4._4_2_ = (sVar6 < (short)local_d8[10]) * local_d8[10] |
                     (ushort)(sVar6 >= (short)local_d8[10]) * sVar6;
      auVar4._6_2_ = (sVar7 < (short)local_d8[0xb]) * local_d8[0xb] |
                     (ushort)(sVar7 >= (short)local_d8[0xb]) * sVar7;
      auVar4._8_2_ = (sVar8 < (short)local_d8[0xc]) * local_d8[0xc] |
                     (ushort)(sVar8 >= (short)local_d8[0xc]) * sVar8;
      auVar4._10_2_ =
           (sVar9 < (short)local_d8[0xd]) * local_d8[0xd] |
           (ushort)(sVar9 >= (short)local_d8[0xd]) * sVar9;
      auVar4._12_2_ =
           (sVar10 < (short)local_d8[0xe]) * local_d8[0xe] |
           (ushort)(sVar10 >= (short)local_d8[0xe]) * sVar10;
      auVar4._14_2_ =
           (sVar11 < (short)local_d8[0xf]) * local_d8[0xf] |
           (ushort)(sVar11 >= (short)local_d8[0xf]) * sVar11;
      auVar13 = psraw(auVar13,3);
      auVar4 = psraw(auVar4,3);
      sVar12 = auVar13._0_2_;
      sVar14 = auVar13._2_2_;
      sVar15 = auVar13._4_2_;
      sVar16 = auVar13._6_2_;
      sVar17 = auVar13._8_2_;
      sVar18 = auVar13._10_2_;
      sVar19 = auVar13._12_2_;
      sVar20 = auVar13._14_2_;
      sVar3 = auVar4._0_2_;
      sVar5 = auVar4._2_2_;
      sVar6 = auVar4._4_2_;
      sVar7 = auVar4._6_2_;
      sVar8 = auVar4._8_2_;
      sVar9 = auVar4._10_2_;
      sVar10 = auVar4._12_2_;
      sVar11 = auVar4._14_2_;
      local_d8[0] = (ushort)(0x1f < sVar12) * 0x1f | (ushort)(0x1f >= sVar12) * sVar12;
      local_d8[1] = (ushort)(0x1f < sVar14) * 0x1f | (ushort)(0x1f >= sVar14) * sVar14;
      local_d8[2] = (ushort)(0x1f < sVar15) * 0x1f | (ushort)(0x1f >= sVar15) * sVar15;
      local_d8[3] = (ushort)(0x1f < sVar16) * 0x1f | (ushort)(0x1f >= sVar16) * sVar16;
      local_d8[4] = (ushort)(0x1f < sVar17) * 0x1f | (ushort)(0x1f >= sVar17) * sVar17;
      local_d8[5] = (ushort)(0x1f < sVar18) * 0x1f | (ushort)(0x1f >= sVar18) * sVar18;
      local_d8[6] = (ushort)(0x1f < sVar19) * 0x1f | (ushort)(0x1f >= sVar19) * sVar19;
      local_d8[7] = (ushort)(0x1f < sVar20) * 0x1f | (ushort)(0x1f >= sVar20) * sVar20;
      local_d8[8] = (ushort)(0x1f < sVar3) * 0x1f | (ushort)(0x1f >= sVar3) * sVar3;
      local_d8[9] = (ushort)(0x1f < sVar5) * 0x1f | (ushort)(0x1f >= sVar5) * sVar5;
      local_d8[10] = (ushort)(0x1f < sVar6) * 0x1f | (ushort)(0x1f >= sVar6) * sVar6;
      local_d8[0xb] = (ushort)(0x1f < sVar7) * 0x1f | (ushort)(0x1f >= sVar7) * sVar7;
      local_d8[0xc] = (ushort)(0x1f < sVar8) * 0x1f | (ushort)(0x1f >= sVar8) * sVar8;
      local_d8[0xd] = (ushort)(0x1f < sVar9) * 0x1f | (ushort)(0x1f >= sVar9) * sVar9;
      local_d8[0xe] = (ushort)(0x1f < sVar10) * 0x1f | (ushort)(0x1f >= sVar10) * sVar10;
      local_d8[0xf] = (ushort)(0x1f < sVar11) * 0x1f | (ushort)(0x1f >= sVar11) * sVar11;
      lVar1 = 0;
      do {
        *(int *)(local_b8 + (long)(short)local_d8[lVar1] * 4) =
             *(int *)(local_b8 + (long)(short)local_d8[lVar1] * 4) + 1;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0x10);
      lVar2 = lVar2 + 1;
    } while (lVar2 != end_block);
  }
  VP8SetHistogramData((int *)local_b8,histo);
  return;
}

Assistant:

static void CollectHistogram_SSE2(const uint8_t* ref, const uint8_t* pred,
                                  int start_block, int end_block,
                                  VP8Histogram* const histo) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i max_coeff_thresh = _mm_set1_epi16(MAX_COEFF_THRESH);
  int j;
  int distribution[MAX_COEFF_THRESH + 1] = { 0 };
  for (j = start_block; j < end_block; ++j) {
    int16_t out[16];
    int k;

    FTransform_SSE2(ref + VP8DspScan[j], pred + VP8DspScan[j], out);

    // Convert coefficients to bin (within out[]).
    {
      // Load.
      const __m128i out0 = _mm_loadu_si128((__m128i*)&out[0]);
      const __m128i out1 = _mm_loadu_si128((__m128i*)&out[8]);
      const __m128i d0 = _mm_sub_epi16(zero, out0);
      const __m128i d1 = _mm_sub_epi16(zero, out1);
      const __m128i abs0 = _mm_max_epi16(out0, d0);   // abs(v), 16b
      const __m128i abs1 = _mm_max_epi16(out1, d1);
      // v = abs(out) >> 3
      const __m128i v0 = _mm_srai_epi16(abs0, 3);
      const __m128i v1 = _mm_srai_epi16(abs1, 3);
      // bin = min(v, MAX_COEFF_THRESH)
      const __m128i bin0 = _mm_min_epi16(v0, max_coeff_thresh);
      const __m128i bin1 = _mm_min_epi16(v1, max_coeff_thresh);
      // Store.
      _mm_storeu_si128((__m128i*)&out[0], bin0);
      _mm_storeu_si128((__m128i*)&out[8], bin1);
    }

    // Convert coefficients to bin.
    for (k = 0; k < 16; ++k) {
      ++distribution[out[k]];
    }
  }
  VP8SetHistogramData(distribution, histo);
}